

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPubkey * __thiscall
cfd::core::HDWallet::GeneratePubkey
          (ExtPubkey *__return_storage_ptr__,HDWallet *this,NetType network_type)

{
  undefined1 local_98 [8];
  ExtPrivkey privkey;
  NetType network_type_local;
  HDWallet *this_local;
  
  privkey.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._4_4_ = network_type;
  ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_98,&this->seed_,network_type);
  ExtPrivkey::GetExtPubkey(__return_storage_ptr__,(ExtPrivkey *)local_98);
  ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_98);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey HDWallet::GeneratePubkey(NetType network_type) const {
  ExtPrivkey privkey(seed_, network_type);
  return privkey.GetExtPubkey();
}